

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool QtPrivate::equalStrings(QBasicUtf8StringView<false> lhs,QBasicUtf8StringView<false> rhs)

{
  int iVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  const_pointer __s1;
  const_pointer __s2;
  size_t __n;
  long in_FS_OFFSET;
  bool local_39;
  bool local_29;
  QBasicUtf8StringView<false> local_28;
  QBasicUtf8StringView<false> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QBasicUtf8StringView<false>::size(&local_18);
  qVar3 = QBasicUtf8StringView<false>::size(&local_28);
  if (qVar2 == qVar3) {
    qVar2 = QBasicUtf8StringView<false>::size(&local_18);
    local_39 = true;
    if (qVar2 != 0) {
      __s1 = QBasicUtf8StringView<false>::data(&local_18);
      __s2 = QBasicUtf8StringView<false>::data(&local_28);
      __n = QBasicUtf8StringView<false>::size(&local_18);
      iVar1 = memcmp(__s1,__s2,__n);
      local_39 = iVar1 == 0;
    }
    local_29 = local_39;
  }
  else {
    local_29 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QtPrivate::equalStrings(QBasicUtf8StringView<false> lhs, QBasicUtf8StringView<false> rhs) noexcept
{
#if QT_VERSION >= QT_VERSION_CHECK(7, 0, 0) || defined(QT_BOOTSTRAPPED) || defined(QT_STATIC)
    Q_ASSERT(lhs.size() == rhs.size());
#else
    // operator== didn't enforce size prior to Qt 6.2
    if (lhs.size() != rhs.size())
        return false;
#endif
    return (!lhs.size() || memcmp(lhs.data(), rhs.data(), lhs.size()) == 0);
}